

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::save_to_file(CVmObjLookupTable *this,CVmFile *fp)

{
  uint *puVar1;
  uint16_t tmp;
  int iVar2;
  vm_val_t *val;
  uint uVar3;
  uint v;
  long lVar4;
  bool bVar5;
  char buf [12];
  
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  CVmFile::write_uint2(fp,*puVar1);
  CVmFile::write_uint2(fp,puVar1[1]);
  if (*(long *)(puVar1 + 2) == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (int)(((*(long *)(puVar1 + 2) - (long)(puVar1 + (ulong)*puVar1 * 2)) + -0x20) / 0x28) +
            1;
  }
  CVmFile::write_uint2(fp,uVar3);
  iVar2 = CVmObject::image_file_version_ge((CVmObject *)this,"030003");
  if (iVar2 != 0) {
    vmb_put_dh(buf,(vm_val_t *)(puVar1 + 4));
    CVmFile::write_bytes(fp,buf,5);
  }
  uVar3 = *puVar1;
  for (lVar4 = 0; uVar3 != (uint)lVar4; lVar4 = lVar4 + 1) {
    if (*(long *)(puVar1 + lVar4 * 2 + 8) == 0) {
      v = 0;
    }
    else {
      v = (int)((*(long *)(puVar1 + lVar4 * 2 + 8) - (long)(puVar1 + (ulong)*puVar1 * 2 + 8)) / 0x28
               ) + 1;
    }
    CVmFile::write_uint2(fp,v);
  }
  uVar3 = puVar1[1];
  val = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 8);
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    vmb_put_dh(buf,val);
    vmb_put_dh(buf + 5,val + 1);
    if (*(long *)(val + 2) == 0) {
      buf._10_2_ = 0;
    }
    else {
      buf._10_2_ = (short)((*(long *)(val + 2) - (long)(puVar1 + (ulong)*puVar1 * 2 + 8)) / 0x28) +
                   1;
    }
    CVmFile::write_bytes(fp,buf,0xc);
    val = (vm_val_t *)&val[2].val;
  }
  return;
}

Assistant:

void CVmObjLookupTable::save_to_file(VMG_ class CVmFile *fp)
{
    vm_lookup_ext *ext = get_ext();
    uint i;
    vm_lookup_val **bp;
    vm_lookup_val *val;
    char buf[VMLOOKUP_VALUE_SIZE];

    /* write our bucket count, value count, and first-free index */
    fp->write_uint2(ext->bucket_cnt);
    fp->write_uint2(ext->value_cnt);
    fp->write_uint2(ext->val_to_img_idx(ext->first_free));

    /*
     *   If the image file was compiled for version 030003 or later of the
     *   LookupTable object, save the default value.  The default value
     *   wasn't added until 030003, so source code compiled against earlier
     *   versions of the metaclass spec can't change it from the 'nil'
     *   default.  Furthermore, these image files could be loaded on VMs that
     *   have older versions of the metaclass that won't know to look for a
     *   default value in the loaded data, so to be compatible with those
     *   readers we must omit the value entirely.  If the image file was
     *   compiled with 030003 or later, it can only be loaded by VMs with
     *   LookupTable implementations that know to read the value.  
     */
    if (image_file_version_ge(vmg_ "030003"))
    {
        vmb_put_dh(buf, &ext->default_value);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }

    /* write the buckets */
    for (i = ext->bucket_cnt, bp = ext->buckets ; i != 0 ; --i, ++bp)
        fp->write_uint2(ext->val_to_img_idx(*bp));

    /* write the values */
    for (i = ext->value_cnt, val = ext->idx_to_val(0) ; i != 0 ; --i, ++val)
    {
        uint idx;
        
        /* store the key, value, and index */
        vmb_put_dh(buf, &val->key);
        vmb_put_dh(buf + VMB_DATAHOLDER, &val->val);
        idx = ext->val_to_img_idx(val->nxt);
        oswp2(buf + VMB_DATAHOLDER*2, idx);

        /* write the data */
        fp->write_bytes(buf, VMLOOKUP_VALUE_SIZE);
    }
}